

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlAttrPtr xmlSetNsProp(xmlNodePtr node,xmlNsPtr ns,xmlChar *name,xmlChar *value)

{
  _xmlDoc *p_Var1;
  int iVar2;
  _xmlNode *attr;
  xmlChar *pxVar3;
  xmlNodePtr pxVar4;
  _xmlNode *p_Var5;
  xmlAttrPtr pxVar6;
  
  if (ns == (xmlNsPtr)0x0) {
    pxVar3 = (xmlChar *)0x0;
  }
  else {
    pxVar3 = ns->href;
    if (pxVar3 == (xmlChar *)0x0) {
      return (xmlAttrPtr)0x0;
    }
  }
  attr = (_xmlNode *)xmlGetPropNodeInternal(node,name,pxVar3,0);
  if (attr != (_xmlNode *)0x0) {
    if (*(xmlAttributeType *)&attr->content == XML_ATTRIBUTE_ID) {
      xmlRemoveID(node->doc,(xmlAttrPtr)attr);
      *(xmlAttributeType *)&attr->content = XML_ATTRIBUTE_ID;
    }
    if (attr->children != (xmlNodePtr)0x0) {
      xmlFreeNodeList(attr->children);
    }
    attr->children = (_xmlNode *)0x0;
    attr->last = (_xmlNode *)0x0;
    attr->ns = ns;
    if (value != (xmlChar *)0x0) {
      iVar2 = xmlCheckUTF8(value);
      if ((iVar2 == 0) &&
         (__xmlSimpleError(2,0x517,(xmlNodePtr)node->doc,"string is not in UTF-8\n",(char *)0x0),
         node->doc != (_xmlDoc *)0x0)) {
        pxVar3 = xmlStrdup((xmlChar *)"ISO-8859-1");
        node->doc->encoding = pxVar3;
      }
      p_Var1 = node->doc;
      pxVar4 = xmlNewText(value);
      if (pxVar4 != (xmlNodePtr)0x0) {
        pxVar4->doc = p_Var1;
      }
      attr->children = pxVar4;
      attr->last = (_xmlNode *)0x0;
      if (pxVar4 != (xmlNodePtr)0x0) {
        do {
          p_Var5 = pxVar4;
          p_Var5->parent = attr;
          pxVar4 = p_Var5->next;
        } while (p_Var5->next != (_xmlNode *)0x0);
        attr->last = p_Var5;
      }
    }
    if (*(int *)&attr->content == 2) {
      xmlAddID((xmlValidCtxtPtr)0x0,node->doc,value,(xmlAttrPtr)attr);
    }
    return (xmlAttrPtr)attr;
  }
  pxVar6 = xmlNewPropInternal(node,ns,name,value,0);
  return pxVar6;
}

Assistant:

xmlAttrPtr
xmlSetNsProp(xmlNodePtr node, xmlNsPtr ns, const xmlChar *name,
	     const xmlChar *value)
{
    xmlAttrPtr prop;

    if (ns && (ns->href == NULL))
	return(NULL);
    prop = xmlGetPropNodeInternal(node, name, (ns != NULL) ? ns->href : NULL, 0);
    if (prop != NULL) {
	/*
	* Modify the attribute's value.
	*/
	if (prop->atype == XML_ATTRIBUTE_ID) {
	    xmlRemoveID(node->doc, prop);
	    prop->atype = XML_ATTRIBUTE_ID;
	}
	if (prop->children != NULL)
	    xmlFreeNodeList(prop->children);
	prop->children = NULL;
	prop->last = NULL;
	prop->ns = ns;
	if (value != NULL) {
	    xmlNodePtr tmp;

	    if(!xmlCheckUTF8(value)) {
	        xmlTreeErr(XML_TREE_NOT_UTF8, (xmlNodePtr) node->doc,
	                   NULL);
                if (node->doc != NULL)
                    node->doc->encoding = xmlStrdup(BAD_CAST "ISO-8859-1");
	    }
	    prop->children = xmlNewDocText(node->doc, value);
	    prop->last = NULL;
	    tmp = prop->children;
	    while (tmp != NULL) {
		tmp->parent = (xmlNodePtr) prop;
		if (tmp->next == NULL)
		    prop->last = tmp;
		tmp = tmp->next;
	    }
	}
	if (prop->atype == XML_ATTRIBUTE_ID)
	    xmlAddID(NULL, node->doc, value, prop);
	return(prop);
    }
    /*
    * No equal attr found; create a new one.
    */
    return(xmlNewPropInternal(node, ns, name, value, 0));
}